

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jurassic-jigsaw.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  double dVar1;
  variant_alternative_t<1UL,_variant<int,_basic_ifstream<char>_>_> *file_00;
  ulong uVar2;
  ostream *poVar3;
  size_t sVar4;
  variant_alternative_t<0UL,_variant<int,_basic_ifstream<char>_>_> *pvVar5;
  int iVar6;
  pointer state_00;
  optional<unsigned_long> oVar7;
  vector<state_t,_std::allocator<state_t>_> res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  tiles_t tiles;
  state_t state;
  variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> file;
  vector<state_t,_std::allocator<state_t>_> local_3e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d0;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_generic_tile_t<10UL>_>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_3b8;
  state_t local_380;
  tuple<std::unordered_multimap<std::array<char,_10UL>,_tile_orientation_t,_generic_tile_t<10UL>::line_hash,_std::equal_to<std::array<char,_10UL>_>,_std::allocator<std::pair<const_std::array<char,_10UL>,_tile_orientation_t>_>_>,_std::unordered_multimap<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t,_generic_tile_t<10UL>::corner_hash,_std::equal_to<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>_>,_std::allocator<std::pair<const_std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t>_>_>_>
  local_318;
  state_t local_2a8;
  _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_> local_240;
  
  if (argc == 2) {
    get_input((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)&local_240,2,argv
             );
    if (local_240._M_index == '\0') {
      pvVar5 = std::get<0ul,int,std::ifstream>
                         ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                          &local_240);
      iVar6 = *pvVar5;
    }
    else {
      file_00 = std::get<1ul,int,std::ifstream>
                          ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                           &local_240);
      tokenize_abi_cxx11_<std::ifstream>(&local_3d0,file_00);
      read_tiles((tiles_t *)&local_3b8,&local_3d0);
      make_catalogs(&local_318,(tiles_t *)&local_3b8);
      dVar1 = SQRT(((double)CONCAT44(0x45300000,(int)(local_3b8._M_element_count >> 0x20)) -
                   1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_3b8._M_element_count) -
                   4503599627370496.0));
      uVar2 = (ulong)dVar1;
      uVar2 = (long)(dVar1 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
      state_t::state_t(&local_380,uVar2,uVar2,(tiles_t *)&local_3b8);
      std::
      vector<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
      ::vector(&local_2a8.image,&local_380.image);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_Rb_tree(&local_2a8.available._M_t,&local_380.available._M_t);
      local_2a8.w = local_380.w;
      local_2a8.h = local_380.h;
      local_2a8.row = local_380.row;
      local_2a8.col = local_380.col;
      solve(&local_3e8,(tiles_t *)&local_3b8,
            &local_318.
             super__Tuple_impl<0UL,_std::unordered_multimap<std::array<char,_10UL>,_tile_orientation_t,_generic_tile_t<10UL>::line_hash,_std::equal_to<std::array<char,_10UL>_>,_std::allocator<std::pair<const_std::array<char,_10UL>,_tile_orientation_t>_>_>,_std::unordered_multimap<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t,_generic_tile_t<10UL>::corner_hash,_std::equal_to<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>_>,_std::allocator<std::pair<const_std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t>_>_>_>
             .
             super__Head_base<0UL,_std::unordered_multimap<std::array<char,_10UL>,_tile_orientation_t,_generic_tile_t<10UL>::line_hash,_std::equal_to<std::array<char,_10UL>_>,_std::allocator<std::pair<const_std::array<char,_10UL>,_tile_orientation_t>_>_>,_false>
             ._M_head_impl,(corner_tile_catalog_t *)&local_318,&local_2a8);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_2a8.available._M_t);
      std::
      vector<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
      ::~vector(&local_2a8.image);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Part 1: ",8);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if (local_3e8.super__Vector_base<state_t,_std::allocator<state_t>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_3e8.super__Vector_base<state_t,_std::allocator<state_t>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        state_00 = local_3e8.super__Vector_base<state_t,_std::allocator<state_t>_>._M_impl.
                   super__Vector_impl_data._M_start;
        do {
          oVar7 = sea_roughness((tiles_t *)&local_3b8,state_00);
          if (((undefined1  [16])
               oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Part 2: ",8);
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
            break;
          }
          state_00 = state_00 + 1;
        } while (state_00 !=
                 local_3e8.super__Vector_base<state_t,_std::allocator<state_t>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      std::vector<state_t,_std::allocator<state_t>_>::~vector(&local_3e8);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_380.available._M_t);
      std::
      vector<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
      ::~vector(&local_380.image);
      std::
      _Hashtable<std::array<char,_10UL>,_std::pair<const_std::array<char,_10UL>,_tile_orientation_t>,_std::allocator<std::pair<const_std::array<char,_10UL>,_tile_orientation_t>_>,_std::__detail::_Select1st,_std::equal_to<std::array<char,_10UL>_>,_generic_tile_t<10UL>::line_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
      ::~_Hashtable((_Hashtable<std::array<char,_10UL>,_std::pair<const_std::array<char,_10UL>,_tile_orientation_t>,_std::allocator<std::pair<const_std::array<char,_10UL>,_tile_orientation_t>_>,_std::__detail::_Select1st,_std::equal_to<std::array<char,_10UL>_>,_generic_tile_t<10UL>::line_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                     *)&local_318.
                        super__Tuple_impl<0UL,_std::unordered_multimap<std::array<char,_10UL>,_tile_orientation_t,_generic_tile_t<10UL>::line_hash,_std::equal_to<std::array<char,_10UL>_>,_std::allocator<std::pair<const_std::array<char,_10UL>,_tile_orientation_t>_>_>,_std::unordered_multimap<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t,_generic_tile_t<10UL>::corner_hash,_std::equal_to<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>_>,_std::allocator<std::pair<const_std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t>_>_>_>
                        .
                        super__Head_base<0UL,_std::unordered_multimap<std::array<char,_10UL>,_tile_orientation_t,_generic_tile_t<10UL>::line_hash,_std::equal_to<std::array<char,_10UL>_>,_std::allocator<std::pair<const_std::array<char,_10UL>,_tile_orientation_t>_>_>,_false>
                   );
      std::
      _Hashtable<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_std::pair<const_std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t>,_std::allocator<std::pair<const_std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>_>,_generic_tile_t<10UL>::corner_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
      ::~_Hashtable((_Hashtable<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_std::pair<const_std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t>,_std::allocator<std::pair<const_std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>_>,_generic_tile_t<10UL>::corner_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                     *)&local_318);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_generic_tile_t<10UL>_>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_3b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3d0);
      iVar6 = 0;
    }
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::
    ~_Variant_storage(&local_240);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0f0);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," {path-to-file}",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  if (argc != 2) {
    std::cout << "Usage: " << argv[0] << " {path-to-file}" << std::endl;
    return 1;
  }

  auto file = get_input(argc, argv);

  if (std::holds_alternative<int>(file))
    return std::get<int>(file);

  auto& input = std::get<std::ifstream>(file);

  auto tokens = tokenize(input);

  auto tiles = read_tiles(tokens);

  // make LUTs
  auto [edges, corners] = make_catalogs(tiles);

  // try a logical image size: square N x N
  size_t x = std::sqrt(tiles.size());
  auto state = state_t { x, x, tiles };
  auto res = solve(tiles, edges, corners, state);

  auto a1 = res.front().magic_number();
  std::cout << "Part 1: " << a1 << "\n";

  size_t a2;
  for (const auto& r : res) {
    auto rough = sea_roughness(tiles, r);
    if (rough) {
      a2 = *rough;
      std::cout << "Part 2: " <<  a2 << "\n";
      break;
    }
  }

  std::cout << a1 << "\n" << a2 << "\n";
}